

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  Mat *pMVar10;
  int kk;
  ulong uVar11;
  char *pcVar12;
  int m;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  ulong local_138;
  undefined8 local_120;
  Mat local_118;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  Mat *local_b8;
  long local_b0;
  long local_a8;
  Mat *local_a0;
  long local_98;
  void *local_90;
  int local_84;
  int local_80;
  uint local_7c;
  Mat local_78;
  
  local_b8 = kernel;
  get_optimal_tile_mnk_int8(outch,0,inch,(int *)&local_7c,&local_80,&local_84,opt->num_threads);
  local_d0 = (ulong)local_7c;
  uVar16 = (long)(int)(outch + local_7c + -1) / (long)(int)local_7c;
  lVar17 = (long)local_84;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_c8 = (ulong)(uint)outch;
  Mat::create(&local_78,local_84 * local_7c * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  iVar8 = (int)uVar16;
  local_a0 = AT;
  Mat::create(AT,local_84 * local_7c,0x24,(local_84 + inch + -1) / local_84,iVar8,4,(Allocator *)0x0
             );
  if (0 < iVar8) {
    local_b0 = (long)inch;
    local_c0 = uVar16 & 0xffffffff;
    local_138 = 0;
    local_a8 = lVar17;
    do {
      iVar8 = get_omp_thread_num();
      if (0 < inch) {
        local_120 = (Mat *)((long)iVar8 * local_78.cstep *
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                           (long)local_78.data);
        local_98 = local_138 * local_d0;
        uVar15 = (int)local_c8 - (int)(local_138 * local_d0);
        uVar16 = (ulong)uVar15;
        if ((int)local_d0 < (int)uVar15) {
          uVar16 = local_d0 & 0xffffffff;
        }
        uVar14 = 0;
        lVar13 = lVar17;
        do {
          lVar17 = local_a8;
          uVar15 = inch - (int)uVar14;
          if ((int)(uint)lVar13 < (int)uVar15) {
            uVar15 = (uint)lVar13;
          }
          if (0 < (int)uVar16) {
            local_90 = local_b8->data;
            uVar9 = 0;
            pMVar10 = local_120;
            do {
              if (0 < (int)uVar15) {
                uVar11 = 0;
                do {
                  pcVar12 = (char *)((long)local_90 +
                                    (uVar11 + uVar14) * 9 +
                                    (long)(((int)local_98 + (int)uVar9) * inch * 9));
                  lVar13 = 0;
                  do {
                    cVar1 = *pcVar12;
                    cVar2 = pcVar12[1];
                    cVar3 = pcVar12[2];
                    *(short *)((long)&local_118.data + lVar13 * 2) = cVar1 * 6;
                    *(short *)((long)&local_118.data + lVar13 * 2 + 6) =
                         -(cVar3 * 4 + cVar2 * 4 + cVar1 * 4);
                    *(short *)((long)&local_118.refcount + lVar13 * 2 + 4) =
                         cVar2 * 4 + cVar1 * -4 + cVar3 * -4;
                    *(short *)((long)&local_118.elemsize + lVar13 * 2 + 2) =
                         (short)cVar1 + cVar2 * 2 + cVar3 * 4;
                    *(short *)((long)&local_118.elempack + lVar13 * 2) =
                         ((short)cVar1 - ((short)cVar2 + (short)cVar2)) + cVar3 * 4;
                    *(short *)(&local_118.field_0x1e + lVar13 * 2) = cVar3 * 6;
                    pcVar12 = pcVar12 + 3;
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                  lVar13 = 4;
                  do {
                    sVar4 = *(short *)((long)&local_120 + lVar13 + 4);
                    sVar5 = *(short *)((long)&local_120 + lVar13 + 6);
                    sVar6 = *(short *)((long)&local_118.data + lVar13);
                    *(short *)&pMVar10->data = sVar4 * 6;
                    *(short *)((long)&pMVar10->data + 2) = -(sVar6 * 4 + sVar5 * 4 + sVar4 * 4);
                    *(short *)((long)&pMVar10->data + 4) = sVar5 * 4 + sVar4 * -4 + sVar6 * -4;
                    *(short *)((long)&pMVar10->data + 6) = sVar4 + sVar5 * 2 + sVar6 * 4;
                    *(short *)&pMVar10->refcount = sVar4 + sVar5 * -2 + sVar6 * 4;
                    *(short *)((long)&pMVar10->refcount + 2) = sVar6 * 6;
                    pMVar10 = (Mat *)((long)&pMVar10->refcount + 4);
                    lVar13 = lVar13 + 6;
                  } while (lVar13 != 0x28);
                  uVar11 = uVar11 + 1;
                } while (uVar11 != uVar15);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar16);
          }
          local_118.w = local_a0->w;
          local_118.elemsize = local_a0->elemsize;
          local_118.h = local_a0->h;
          local_118.elempack = local_a0->elempack;
          local_118.allocator = local_a0->allocator;
          local_118.cstep = (long)local_118.h * (long)local_118.w;
          local_118.data =
               (void *)((long)local_a0->data +
                       local_118.elemsize * local_118.cstep *
                       (long)(int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                         uVar14 & 0xffffffff) / (long)(int)local_a8) +
                       local_a0->cstep * local_138 * local_118.elemsize);
          local_118.refcount = (int *)0x0;
          local_118.dims = 2;
          local_118.d = 1;
          local_118.c = 1;
          pack_A_tile_int8(local_120,&local_118,0x24,(int)uVar16,uVar15);
          uVar14 = uVar14 + lVar17;
          lVar13 = lVar17;
        } while ((long)uVar14 < local_b0);
      }
      local_138 = local_138 + 1;
    } while (local_138 != local_c0);
  }
  piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_int8(kernel, AT, inch, outch, opt);
}